

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::HeapArgumentsObject::GetPropertyQuery
          (HeapArgumentsObject *this,Var originalInstance,PropertyId propertyId,Var *value,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  uint uVar1;
  BOOL BVar2;
  uint32 uVar3;
  int iVar4;
  PropertyQueryFlags val;
  RecyclableObject *pRVar5;
  uint local_4c;
  ScriptContext *pSStack_48;
  uint32 index;
  ScriptContext *scriptContext;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var *value_local;
  Var pvStack_20;
  PropertyId propertyId_local;
  Var originalInstance_local;
  HeapArgumentsObject *this_local;
  
  scriptContext = requestContext;
  requestContext_local = (ScriptContext *)info;
  info_local = (PropertyValueInfo *)value;
  value_local._4_4_ = propertyId;
  pvStack_20 = originalInstance;
  originalInstance_local = this;
  pSStack_48 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  BVar2 = ScriptContext::IsNumericPropertyId(pSStack_48,value_local._4_4_,&local_4c);
  uVar1 = local_4c;
  if (((BVar2 == 0) || (uVar3 = GetNumberOfArguments(this), uVar3 <= uVar1)) ||
     (iVar4 = (*(this->super_ArgumentsObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x70])(this,(ulong)local_4c,info_local,scriptContext), iVar4 == 0)) {
    val = DynamicObject::GetPropertyQuery
                    ((DynamicObject *)this,pvStack_20,value_local._4_4_,&info_local->m_instance,
                     (PropertyValueInfo *)requestContext_local,scriptContext);
    BVar2 = JavascriptConversion::PropertyQueryFlagsToBoolean(val);
    if (BVar2 == 0) {
      pRVar5 = ScriptContext::GetMissingPropertyResult(scriptContext);
      info_local->m_instance = pRVar5;
      this_local._4_4_ = Property_NotFound;
    }
    else {
      this_local._4_4_ = Property_Found;
    }
  }
  else {
    this_local._4_4_ = Property_Found;
  }
  return this_local._4_4_;
}

Assistant:

PropertyQueryFlags HeapArgumentsObject::GetPropertyQuery(Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        ScriptContext *scriptContext = GetScriptContext();

        // Try to get a numbered property that maps to an actual argument.
        uint32 index;
        if (scriptContext->IsNumericPropertyId(propertyId, &index) && index < this->HeapArgumentsObject::GetNumberOfArguments())
        {
            if (this->GetItemAt(index, value, requestContext))
            {
                return PropertyQueryFlags::Property_Found;
            }
        }

        if (JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::GetPropertyQuery(originalInstance, propertyId, value, info, requestContext)))
        {
            // Property has been pre-set and not deleted. Use it.
            return PropertyQueryFlags::Property_Found;
        }

        *value = requestContext->GetMissingPropertyResult();
        return PropertyQueryFlags::Property_NotFound;
    }